

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.h
# Opt level: O0

RangeDynamicLayerParams * __thiscall
CoreML::Specification::NeuralNetworkLayer::mutable_rangedynamic(NeuralNetworkLayer *this)

{
  bool bVar1;
  RangeDynamicLayerParams *this_00;
  NeuralNetworkLayer *this_local;
  
  bVar1 = has_rangedynamic(this);
  if (!bVar1) {
    clear_layer(this);
    set_has_rangedynamic(this);
    this_00 = (RangeDynamicLayerParams *)operator_new(0x20);
    RangeDynamicLayerParams::RangeDynamicLayerParams(this_00);
    (this->layer_).rangedynamic_ = this_00;
  }
  return (RangeDynamicLayerParams *)(this->layer_).convolution_;
}

Assistant:

inline ::CoreML::Specification::RangeDynamicLayerParams* NeuralNetworkLayer::mutable_rangedynamic() {
  if (!has_rangedynamic()) {
    clear_layer();
    set_has_rangedynamic();
    layer_.rangedynamic_ = new ::CoreML::Specification::RangeDynamicLayerParams;
  }
  // @@protoc_insertion_point(field_mutable:CoreML.Specification.NeuralNetworkLayer.rangeDynamic)
  return layer_.rangedynamic_;
}